

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O1

size_t __thiscall
Memory::
SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
GetNonEmptyHeapBlockCount
          (SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
           *this,bool checkCount)

{
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  size_t sVar5;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *pSVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  undefined8 *in_FS_OFFSET;
  
  lVar7 = 0;
  sVar5 = HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
          GetNonEmptyHeapBlockCount
                    (&this->
                      super_HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
                     ,false);
  pSVar6 = this->partialHeapBlockList;
  if (pSVar6 != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    lVar7 = 0;
    do {
      pSVar1 = (pSVar6->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
               super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
      if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
        pSVar6 = (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      }
      else {
        pSVar6 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>
                           (&pSVar1->super_HeapBlock);
      }
      lVar7 = lVar7 + 1;
    } while (pSVar6 != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0);
  }
  pSVar6 = this->partialSweptHeapBlockList;
  lVar9 = 0;
  while (pSVar6 != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    pSVar1 = (pSVar6->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
             super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      pSVar6 = (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    }
    else {
      pSVar6 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>
                         (&pSVar1->super_HeapBlock);
    }
    lVar9 = lVar9 + 1;
  }
  uVar8 = lVar7 + sVar5 + lVar9;
  if ((checkCount) &&
     (uVar8 != (this->
               super_HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
               ).super_HeapBucket.heapBlockCount)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x2d4,
                       "(!checkCount || this->heapBlockCount == currentHeapBlockCount || (this->heapBlockCount >= 65535 && allocatingDuringConcurrentSweep))"
                       ,
                       "!checkCount || this->heapBlockCount == currentHeapBlockCount || (this->heapBlockCount >= 65535 && allocatingDuringConcurrentSweep)"
                      );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  return uVar8;
}

Assistant:

size_t
SmallNormalHeapBucketBase<TBlockType>::GetNonEmptyHeapBlockCount(bool checkCount) const
{
    size_t currentHeapBlockCount = __super::GetNonEmptyHeapBlockCount(false);
    currentHeapBlockCount += HeapBlockList::Count(partialHeapBlockList);
#if ENABLE_CONCURRENT_GC
    currentHeapBlockCount += HeapBlockList::Count(partialSweptHeapBlockList);
#endif
    bool allocatingDuringConcurrentSweep = false;

#if ENABLE_CONCURRENT_GC
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
#if SUPPORT_WIN32_SLIST
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
    {
        allocatingDuringConcurrentSweep = true;
    }
#endif
#endif
#endif
    RECYCLER_SLOW_CHECK(Assert(!checkCount || this->heapBlockCount == currentHeapBlockCount || (this->heapBlockCount >= 65535 && allocatingDuringConcurrentSweep)));
    return currentHeapBlockCount;
}